

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character-generator.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  char cVar2;
  int iVar3;
  Race *pRVar4;
  AbilityScores *this;
  Skills *this_00;
  Character *pCVar5;
  int iVar6;
  allocator local_9d;
  undefined4 local_9c;
  CharacterClass *local_98;
  int local_8c;
  AbilityScores *local_88;
  Race *local_80;
  string name;
  Character *local_58;
  string local_50 [32];
  
  local_58 = (Character *)0x0;
  iVar3 = parse_args(argc,argv,&local_58);
  iVar6 = 1;
  if (local_58 != (Character *)0x0) goto LAB_00102d71;
  if (RANDOM_FLAG == false) {
    RANDOM_FLAG = (bool)ORPG::Characters::request_is_random();
    if (RANDOM_FLAG != false) goto LAB_00102c16;
    pRVar4 = (Race *)ORPG::Characters::request_race();
  }
  else {
    RANDOM_FLAG = true;
LAB_00102c16:
    pRVar4 = ORPG::Characters::new_random_race();
  }
  if (RANDOM_FLAG == true) {
    this = (AbilityScores *)operator_new(0x38);
    ORPG::AbilityScores::AbilityScores(this,'\0');
  }
  else {
    this = (AbilityScores *)ORPG::Characters::request_scores();
  }
  if (RANDOM_FLAG == true) {
    local_9c = ORPG::Characters::random_bg_id();
  }
  else {
    local_9c = ORPG::Characters::request_background();
  }
  if (RANDOM_FLAG == true) {
    local_98 = ORPG::Characters::new_random_character_class();
  }
  else {
    local_98 = (CharacterClass *)ORPG::Characters::request_class();
  }
  local_8c = iVar3;
  local_88 = this;
  local_80 = pRVar4;
  if (RANDOM_FLAG == true) {
    this_00 = (Skills *)operator_new(0x38);
    ORPG::Skills::Skills(this_00);
  }
  else {
    this_00 = (Skills *)ORPG::Characters::request_skills();
  }
  cVar2 = '\x01';
  cVar1 = '\x01';
  if (RANDOM_FLAG == false) {
    cVar1 = ORPG::Characters::request_hitpoints(local_98);
  }
  if ((RANDOM_FLAG & 1U) == 0) {
    cVar2 = ORPG::Characters::request_equipment();
  }
  if ((RANDOM_FLAG & 1U) == 0) {
    ORPG::Characters::request_name_abi_cxx11_();
  }
  else {
    std::__cxx11::string::string((string *)&name,"",&local_9d);
  }
  pCVar5 = (Character *)operator_new(0xc0);
  std::__cxx11::string::string(local_50,(string *)&name);
  ORPG::Character::Character(pCVar5,local_80,local_88,local_98,local_9c,this_00,local_50);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string((string *)&name);
  iVar3 = local_8c;
  if (cVar1 == '\0' && cVar2 == '\0') {
    return 1;
  }
LAB_00102d71:
  if (iVar3 == 0) {
    if (SHEET_FLAG == false) {
      ORPG::Character::to_string_abi_cxx11_();
    }
    else {
      ORPG::Character::to_ascii_sheet_abi_cxx11_();
    }
    iVar6 = 0;
    printf("%s",name._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&name);
  }
  return iVar6;
}

Assistant:

int main(int argc, char* argv[]) {
    Character* character = nullptr;
    
    int status = parse_args(argc, argv, character); // may exit

    if(character == nullptr) {
        /* begin creating the character here */
        RANDOM_FLAG = RANDOM_FLAG ? RANDOM_FLAG : request_is_random();

        auto race       = RANDOM_FLAG ? new_random_race() : request_race();
        //TODO(incomingstick): randomly generate ability scores, not an empty set
        auto scores     = RANDOM_FLAG ? new AbilityScores : request_scores();
        auto bg         = RANDOM_FLAG ? random_bg_id() : request_background();
        auto charClass  = RANDOM_FLAG ? new_random_character_class() : request_class();
        auto skills     = RANDOM_FLAG ? new Skills : request_skills();
        auto hp         = RANDOM_FLAG ? true : request_hitpoints(charClass);
        auto equipment  = RANDOM_FLAG ? true : request_equipment();
        auto name       = RANDOM_FLAG ? "" : request_name();

        /* IMPORTANT(incomingstick): If this is not a pointer, it will segfault during GC... idk why */
        character = new Character(race, scores, charClass, bg, skills, name);

        if(!hp && !equipment) {
            status = EXIT_FAILURE;
        }
    }

    if(status != EXIT_FAILURE) {
        SHEET_FLAG ? 
            printf("%s", character->to_ascii_sheet().c_str()) :
            printf("%s", character->to_string().c_str());
    }

    return status;
}